

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O3

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *blindout,uint64_t *value_out,uchar *message_out,size_t *outlen,uchar *nonce,
              uint64_t *min_value,uint64_t *max_value,secp256k1_ge *commit,uchar *proof,size_t plen,
              uchar *extra_commit,size_t extra_commit_len,secp256k1_ge *genp)

{
  byte bVar1;
  byte bVar2;
  uchar *m_00;
  uint64_t *puVar3;
  uint exp;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t value;
  ulong uVar7;
  long lVar8;
  secp256k1_scalar *psVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long local_6348;
  int overflow;
  secp256k1_ecmult_gen_context *local_6338;
  uchar *local_6330;
  size_t local_6328;
  uint64_t *local_6320;
  uchar *local_6318;
  size_t *local_6310;
  secp256k1_ecmult_context *local_6308;
  uint64_t local_6300;
  uchar m [33];
  secp256k1_gej accj;
  uchar signs [31];
  secp256k1_scalar blind;
  secp256k1_ge c;
  secp256k1_sha256 local_61a8;
  size_t rsizes [32];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  secp256k1_scalar evalues [128];
  
  if (plen < 0x41) {
    return 0;
  }
  bVar1 = *proof;
  if ((char)bVar1 < '\0') {
    return 0;
  }
  if (bVar1 < 0x40) {
    *max_value = 0;
    exp = 0xffffffff;
    uVar12 = 0;
    local_6328 = 1;
    local_6348 = 1;
  }
  else {
    exp = bVar1 & 0x1f;
    if (0x12 < (byte)exp) {
      return 0;
    }
    bVar2 = proof[1];
    if (0x3f < bVar2) {
      return 0;
    }
    uVar12 = (ulong)(bVar2 + 1);
    uVar7 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
    *max_value = uVar7;
    if ((byte)exp == 0) {
      local_6348 = 1;
      exp = 0;
    }
    else {
      local_6348 = 1;
      uVar5 = exp;
      do {
        if (0x1999999999999999 < uVar7) {
          return 0;
        }
        uVar7 = uVar7 * 10;
        *max_value = uVar7;
        local_6348 = local_6348 * 10;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    local_6328 = 2;
  }
  *min_value = 0;
  if ((bVar1 & 0x20) == 0) {
    uVar7 = 0;
  }
  else {
    if (plen - local_6328 < 8) {
      return 0;
    }
    uVar7 = 0;
    lVar11 = 0;
    do {
      uVar7 = (ulong)proof[lVar11 + local_6328] | uVar7 << 8;
      *min_value = uVar7;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    local_6328 = local_6328 | 8;
  }
  if (CARRY8(uVar7,*max_value)) {
    return 0;
  }
  *max_value = uVar7 + *max_value;
  rsizes[0] = 1;
  iVar4 = (int)uVar12;
  if (iVar4 == 0) {
    uVar7 = 1;
    uVar5 = 1;
  }
  else {
    uVar7 = uVar12 >> 1;
    if (iVar4 == 1) {
      uVar5 = 0;
    }
    else {
      lVar11 = uVar7 + (uVar7 == 0);
      lVar8 = lVar11 + -1;
      auVar14._8_4_ = (int)lVar8;
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar10 = 0;
      auVar14 = auVar14 ^ _DAT_00151e90;
      auVar15 = _DAT_00151e80;
      do {
        auVar16 = auVar15 ^ _DAT_00151e90;
        if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                    auVar14._4_4_ < auVar16._4_4_) & 1)) {
          *(undefined8 *)((long)rsizes + uVar10) = 4;
        }
        if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
            auVar16._12_4_ <= auVar14._12_4_) {
          *(undefined8 *)((long)rsizes + uVar10 + 8) = 4;
        }
        lVar8 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar8 + 2;
        uVar10 = uVar10 + 0x10;
      } while (((int)lVar11 * 8 + 8U & 0xff0) != uVar10);
      uVar5 = iVar4 * 2 & 0xfffffffc;
      if ((uVar12 & 1) == 0) goto LAB_00129aa8;
    }
    rsizes[uVar7] = 2;
    uVar5 = uVar5 | 2;
    uVar7 = uVar7 + 1;
  }
LAB_00129aa8:
  uVar12 = (ulong)((int)uVar7 + 6U >> 3);
  if (plen - local_6328 < (uVar5 + (int)uVar7) * 0x20 + uVar12) {
    return 0;
  }
  local_61a8.s[0] = 0x6a09e667;
  local_61a8.s[1] = 0xbb67ae85;
  local_61a8.s[2] = 0x3c6ef372;
  local_61a8.s[3] = 0xa54ff53a;
  local_61a8.s[4] = 0x510e527f;
  local_61a8.s[5] = 0x9b05688c;
  local_61a8.s[6] = 0x1f83d9ab;
  local_61a8.s[7] = 0x5be0cd19;
  local_61a8.bytes = 0;
  s[1].d[0] = (commit->x).n[4];
  s[0].d[0] = (commit->x).n[0];
  s[0].d[1] = (commit->x).n[1];
  s[0].d[2] = (commit->x).n[2];
  s[0].d[3] = (commit->x).n[3];
  local_6338 = ecmult_gen_ctx;
  local_6330 = message_out;
  local_6318 = blindout;
  local_6310 = outlen;
  local_6308 = ecmult_ctx;
  secp256k1_fe_normalize((secp256k1_fe *)s);
  iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&commit->y);
  m[0] = (byte)iVar4 ^ 1;
  secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
  secp256k1_sha256_write(&local_61a8,m,0x21);
  s[1].d[0] = (genp->x).n[4];
  s[0].d[0] = (genp->x).n[0];
  s[0].d[1] = (genp->x).n[1];
  s[0].d[2] = (genp->x).n[2];
  s[0].d[3] = (genp->x).n[3];
  secp256k1_fe_normalize((secp256k1_fe *)s);
  iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&genp->y);
  m[0] = (byte)iVar4 ^ 1;
  secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
  secp256k1_sha256_write(&local_61a8,m,0x21);
  secp256k1_sha256_write(&local_61a8,proof,local_6328);
  uVar10 = uVar7 - 1;
  if (uVar10 != 0) {
    uVar6 = 0;
    do {
      signs[uVar6] = (proof[(uVar6 >> 3) + local_6328] >> ((uint)uVar6 & 7) & 1) != 0;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
    if (((uVar10 & 7) != 0) && (proof[uVar12 + local_6328 + -1] >> (sbyte)(uVar10 & 7) != 0)) {
      return 0;
    }
  }
  lVar11 = uVar12 + local_6328;
  accj.infinity = 1;
  accj.x.n[0] = 0;
  accj.x.n[1] = 0;
  accj.x.n[2] = 0;
  accj.x.n[3] = 0;
  accj.x.n[4] = 0;
  accj.y.n[0] = 0;
  accj.y.n[1] = 0;
  accj.y.n[2] = 0;
  accj.y.n[3] = 0;
  accj.y.n[4] = 0;
  accj.z.n[0] = 0;
  accj.z.n[1] = 0;
  accj.z.n[2] = 0;
  accj.z.n[3] = 0;
  accj.z.n[4] = 0;
  if (*min_value != 0) {
    secp256k1_pedersen_ecmult_small(&accj,*min_value,genp);
  }
  local_6320 = value_out;
  if (uVar10 == 0) {
    lVar8 = 0;
  }
  else {
    uVar12 = 0;
    lVar8 = 0;
    do {
      iVar4 = secp256k1_fe_set_b32((secp256k1_fe *)s,proof + lVar11);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = secp256k1_ge_set_xquad(&c,(secp256k1_fe *)s);
      if (iVar4 == 0) {
        return 0;
      }
      if (signs[uVar12] != '\0') {
        secp256k1_ge_neg(&c,&c);
      }
      secp256k1_sha256_write(&local_61a8,signs + uVar12,1);
      secp256k1_sha256_write(&local_61a8,proof + lVar11,0x20);
      pubs[lVar8].infinity = c.infinity;
      pubs[lVar8].x.n[0] = c.x.n[0];
      pubs[lVar8].x.n[1] = c.x.n[1];
      pubs[lVar8].x.n[2] = c.x.n[2];
      pubs[lVar8].x.n[3] = c.x.n[3];
      pubs[lVar8].x.n[4] = c.x.n[4];
      pubs[lVar8].y.n[0] = c.y.n[0];
      pubs[lVar8].y.n[1] = c.y.n[1];
      pubs[lVar8].y.n[2] = c.y.n[2];
      pubs[lVar8].y.n[3] = c.y.n[3];
      pubs[lVar8].y.n[4] = c.y.n[4];
      pubs[lVar8].z.n[0] = 1;
      pubs[lVar8].z.n[3] = 0;
      pubs[lVar8].z.n[4] = 0;
      pubs[lVar8].z.n[1] = 0;
      pubs[lVar8].z.n[2] = 0;
      secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
      lVar11 = lVar11 + 0x20;
      lVar8 = lVar8 + rsizes[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  secp256k1_gej_neg(&accj,&accj);
  secp256k1_gej_add_ge_var(pubs + lVar8,&accj,commit,(secp256k1_fe *)0x0);
  if (pubs[lVar8].infinity != 0) {
    return 0;
  }
  secp256k1_rangeproof_pub_expand(pubs,exp,rsizes,uVar7,genp);
  m_00 = local_6330;
  sVar13 = lVar11 + 0x20;
  lVar8 = lVar8 + rsizes[uVar7 - 1];
  if (lVar8 != 0) {
    psVar9 = s;
    do {
      secp256k1_scalar_set_b32(psVar9,proof + sVar13,&overflow);
      if (overflow != 0) {
        return 0;
      }
      sVar13 = sVar13 + 0x20;
      psVar9 = psVar9 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  if (sVar13 == plen) {
    if (extra_commit != (uchar *)0x0) {
      secp256k1_sha256_write(&local_61a8,extra_commit,extra_commit_len);
    }
    secp256k1_sha256_finalize(&local_61a8,m);
    psVar9 = evalues;
    if (nonce == (uchar *)0x0) {
      psVar9 = (secp256k1_scalar *)0x0;
    }
    iVar4 = secp256k1_borromean_verify(local_6308,psVar9,proof + lVar11,s,pubs,rsizes,uVar7,m,0x20);
    puVar3 = local_6320;
    if (nonce != (uchar *)0x0) {
      if (iVar4 == 0) {
        return 0;
      }
      if ((local_6338 != (secp256k1_ecmult_gen_context *)0x0) &&
         (iVar4 = secp256k1_rangeproof_rewind_inner
                            (&blind,&local_6300,m_00,local_6310,evalues,s,rsizes,uVar7,nonce,commit,
                             proof,local_6328,genp), iVar4 != 0)) {
        value = local_6348 * local_6300 + *min_value;
        secp256k1_pedersen_ecmult(local_6338,&accj,&blind,value,genp);
        if (accj.infinity == 0) {
          secp256k1_gej_neg(&accj,&accj);
          secp256k1_gej_add_ge_var(&accj,&accj,commit,(secp256k1_fe *)0x0);
          if (accj.infinity != 0) {
            if (local_6318 != (uchar *)0x0) {
              secp256k1_scalar_get_b32(local_6318,&blind);
            }
            if (puVar3 != (uint64_t *)0x0) {
              *puVar3 = value;
            }
            return 1;
          }
        }
      }
      return 0;
    }
    return iVar4;
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_context* ecmult_ctx,
 const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_pedersen_ecmult_small(&accj, *min_value, genp);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(ecmult_ctx, nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(ecmult_gen_ctx, &accj, &blind, vv, genp);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}